

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGNSPlanner.cpp
# Opt level: O0

void __thiscall
PerseusBGNSPlanner::PerseusBGNSPlanner
          (PerseusBGNSPlanner *this,void **vtt,PlanningUnitDecPOMDPDiscrete *pu,
          QAVParameters *params)

{
  long in_RCX;
  void **in_RSI;
  PlanningUnitDecPOMDPDiscrete *in_RDI;
  PlanningUnitDecPOMDPDiscrete *in_stack_00000010;
  void **in_stack_00000018;
  AlphaVectorBG *in_stack_00000020;
  AlphaVectorPlanning *in_stack_000005a0;
  PerseusNonStationaryQPlanner *in_stack_ffffffffffffffd0;
  
  AlphaVectorBG::AlphaVectorBG(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  PerseusNonStationaryQPlanner::PerseusNonStationaryQPlanner
            (in_stack_ffffffffffffffd0,in_RSI,in_RDI);
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)*in_RSI;
  *(void **)((long)&(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit +
            (long)(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[-3]
            ) = in_RSI[9];
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon = (size_t)in_RSI[10];
  *(undefined4 *)
   &(in_RDI->super_PlanningUnitMADPDiscrete)._m_nrActionHistories.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = *(undefined4 *)(in_RCX + 0x14);
  AlphaVectorPlanning::Initialize(in_stack_000005a0);
  Perseus::Initialize((Perseus *)
                      &(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon);
  return;
}

Assistant:

PerseusBGNSPlanner::PerseusBGNSPlanner(const PlanningUnitDecPOMDPDiscrete* pu,
                                       const QAVParameters& params) :
    AlphaVectorPlanning(pu),
    AlphaVectorBG(pu),
    PerseusNonStationaryQPlanner(pu),
    _m_backupType(params.bgBackupType)
{
    AlphaVectorPlanning::Initialize();
    Perseus::Initialize();
}